

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O0

uint32_t BrotliBuildSimpleHuffmanTable
                   (HuffmanCode *table,int root_bits,uint16_t *val,uint32_t num_symbols)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint16_t t_1;
  int local_118;
  int iStack_114;
  uint16_t t;
  int k;
  int i;
  uint local_e0;
  uint32_t goal_size;
  uint32_t table_size;
  uint32_t num_symbols_local;
  uint16_t *val_local;
  int root_bits_local;
  HuffmanCode *table_local;
  HuffmanCode h_22;
  HuffmanCode h_21;
  HuffmanCode h_20;
  HuffmanCode h_19;
  HuffmanCode h_18;
  HuffmanCode h_17;
  HuffmanCode h_16;
  HuffmanCode h_15;
  HuffmanCode h_14;
  HuffmanCode h_13;
  HuffmanCode h_12;
  HuffmanCode h_11;
  HuffmanCode h_10;
  HuffmanCode h_9;
  HuffmanCode h_8;
  HuffmanCode h_7;
  HuffmanCode h_6;
  HuffmanCode h_5;
  HuffmanCode h_4;
  HuffmanCode h_3;
  HuffmanCode h_2;
  HuffmanCode h_1;
  HuffmanCode h;
  
  local_e0 = 1;
  val_local._4_1_ = (byte)root_bits;
  uVar2 = 1 << (val_local._4_1_ & 0x1f);
  switch(num_symbols) {
  case 0:
    h_1 = (HuffmanCode)(CONCAT22(*val,h_1._0_2_) & 0xffffff00);
    *table = h_1;
    break;
  case 1:
    if (*val < val[1]) {
      h_2.bits = '\x01';
      h_2.value = *val;
      *table = h_2;
      h_3.bits = '\x01';
      h_3.value = val[1];
      table[1] = h_3;
    }
    else {
      h_4.bits = '\x01';
      h_4.value = val[1];
      *table = h_4;
      h_5.bits = '\x01';
      h_5.value = *val;
      table[1] = h_5;
    }
    local_e0 = 2;
    break;
  case 2:
    h_6.bits = '\x01';
    h_6.value = *val;
    *table = h_6;
    h_7.bits = '\x01';
    h_7.value = *val;
    table[2] = h_7;
    if (val[1] < val[2]) {
      h_8.bits = '\x02';
      h_8.value = val[1];
      table[1] = h_8;
      h_9.bits = '\x02';
      h_9.value = val[2];
      table[3] = h_9;
    }
    else {
      h_10.bits = '\x02';
      h_10.value = val[2];
      table[1] = h_10;
      h_11.bits = '\x02';
      h_11.value = val[1];
      table[3] = h_11;
    }
    local_e0 = 4;
    break;
  case 3:
    for (iStack_114 = 0; local_118 = iStack_114, iStack_114 < 3; iStack_114 = iStack_114 + 1) {
      while (local_118 = local_118 + 1, local_118 < 4) {
        if (val[local_118] < val[iStack_114]) {
          uVar1 = val[local_118];
          val[local_118] = val[iStack_114];
          val[iStack_114] = uVar1;
        }
      }
    }
    h_12.bits = '\x02';
    h_12.value = *val;
    *table = h_12;
    h_13.bits = '\x02';
    h_13.value = val[1];
    table[2] = h_13;
    h_14.bits = '\x02';
    h_14.value = val[2];
    table[1] = h_14;
    h_15.bits = '\x02';
    h_15.value = val[3];
    table[3] = h_15;
    local_e0 = 4;
    break;
  case 4:
    if (val[3] < val[2]) {
      uVar1 = val[3];
      val[3] = val[2];
      val[2] = uVar1;
    }
    h_16.bits = '\x01';
    h_16.value = *val;
    *table = h_16;
    h_17.bits = '\x02';
    h_17.value = val[1];
    table[1] = h_17;
    h_18.bits = '\x01';
    h_18.value = *val;
    table[2] = h_18;
    h_19.bits = '\x03';
    h_19.value = val[2];
    table[3] = h_19;
    h_20.bits = '\x01';
    h_20.value = *val;
    table[4] = h_20;
    h_21.bits = '\x02';
    h_21.value = val[1];
    table[5] = h_21;
    h_22.bits = '\x01';
    h_22.value = *val;
    table[6] = h_22;
    table_local._4_4_ = (HuffmanCode)CONCAT31(table_local._5_3_,3);
    table_local._4_4_ = (HuffmanCode)CONCAT22(val[3],table_local._4_2_);
    table[7] = table_local._4_4_;
    local_e0 = 8;
  }
  for (; local_e0 != uVar2; local_e0 = local_e0 << 1) {
    memcpy(table + local_e0,table,(ulong)local_e0 << 2);
  }
  return uVar2;
}

Assistant:

uint32_t BrotliBuildSimpleHuffmanTable(HuffmanCode* table,
                                       int root_bits,
                                       uint16_t* val,
                                       uint32_t num_symbols) {
  uint32_t table_size = 1;
  const uint32_t goal_size = 1U << root_bits;
  switch (num_symbols) {
    case 0:
      table[0] = ConstructHuffmanCode(0, val[0]);
      break;
    case 1:
      if (val[1] > val[0]) {
        table[0] = ConstructHuffmanCode(1, val[0]);
        table[1] = ConstructHuffmanCode(1, val[1]);
      } else {
        table[0] = ConstructHuffmanCode(1, val[1]);
        table[1] = ConstructHuffmanCode(1, val[0]);
      }
      table_size = 2;
      break;
    case 2:
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      if (val[2] > val[1]) {
        table[1] = ConstructHuffmanCode(2, val[1]);
        table[3] = ConstructHuffmanCode(2, val[2]);
      } else {
        table[1] = ConstructHuffmanCode(2, val[2]);
        table[3] = ConstructHuffmanCode(2, val[1]);
      }
      table_size = 4;
      break;
    case 3: {
      int i, k;
      for (i = 0; i < 3; ++i) {
        for (k = i + 1; k < 4; ++k) {
          if (val[k] < val[i]) {
            uint16_t t = val[k];
            val[k] = val[i];
            val[i] = t;
          }
        }
      }
      table[0] = ConstructHuffmanCode(2, val[0]);
      table[2] = ConstructHuffmanCode(2, val[1]);
      table[1] = ConstructHuffmanCode(2, val[2]);
      table[3] = ConstructHuffmanCode(2, val[3]);
      table_size = 4;
      break;
    }
    case 4: {
      if (val[3] < val[2]) {
        uint16_t t = val[3];
        val[3] = val[2];
        val[2] = t;
      }
      table[0] = ConstructHuffmanCode(1, val[0]);
      table[1] = ConstructHuffmanCode(2, val[1]);
      table[2] = ConstructHuffmanCode(1, val[0]);
      table[3] = ConstructHuffmanCode(3, val[2]);
      table[4] = ConstructHuffmanCode(1, val[0]);
      table[5] = ConstructHuffmanCode(2, val[1]);
      table[6] = ConstructHuffmanCode(1, val[0]);
      table[7] = ConstructHuffmanCode(3, val[3]);
      table_size = 8;
      break;
    }
  }
  while (table_size != goal_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }
  return goal_size;
}